

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

int __thiscall MemoryLeakDetectorNode::init(MemoryLeakDetectorNode *this,EVP_PKEY_CTX *ctx)

{
  undefined8 in_RCX;
  undefined4 in_EDX;
  undefined8 in_R8;
  undefined4 in_R9D;
  undefined8 in_stack_00000008;
  undefined4 in_stack_00000010;
  MemLeakPeriod period_local;
  TestMemoryAllocator *allocator_local;
  size_t size_local;
  uint number_local;
  char *memory_local;
  MemoryLeakDetectorNode *this_local;
  
  *(undefined4 *)(this + 8) = in_EDX;
  *(EVP_PKEY_CTX **)(this + 0x10) = ctx;
  *(undefined8 *)this = in_RCX;
  *(undefined8 *)(this + 0x28) = in_R8;
  *(undefined4 *)(this + 0x30) = in_R9D;
  *(undefined8 *)(this + 0x18) = in_stack_00000008;
  *(undefined4 *)(this + 0x20) = in_stack_00000010;
  return (int)this;
}

Assistant:

void MemoryLeakDetectorNode::init(char* memory, unsigned number, size_t size, TestMemoryAllocator* allocator, MemLeakPeriod period, const char* file, int line)
{
    number_ = number;
    memory_ = memory;
    size_ = size;
    allocator_ = allocator;
    period_ = period;
    file_ = file;
    line_ = line;
}